

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *this;
  reference this_00;
  future<void> *iter;
  iterator __end1;
  iterator __begin1;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> *__range1;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [8];
  vector<std::future<void>,_std::allocator<std::future<void>_>_> results;
  code *local_890;
  _Elt_pointer local_888;
  undefined1 local_880 [8];
  type func;
  StockMatcher matcher;
  outputStreamType stream;
  string streamType;
  undefined1 local_2e0 [8];
  string symbolName;
  undefined1 local_2b8 [8];
  string inputFile;
  allocator<char> local_281;
  string local_280;
  undefined1 local_260 [8];
  FeedFileHandler handler;
  char **argv_local;
  int argc_local;
  
  handler.m_tupleItems.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,pcVar1,&local_281);
    FeedFileHandler::FeedFileHandler((FeedFileHandler *)local_260,&local_280,&pool);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    FeedFileHandler::process((FeedFileHandler *)local_260);
    FeedFileHandler::~FeedFileHandler((FeedFileHandler *)local_260);
  }
  else {
    if ((argc != 4) && (argc != 2)) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Invalid Usage : Proper usage is OrderMatchingEngine [inputfile] [symbol] [F/C]"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Invalid Usage : Proper usage is OrderMatchingEngine [feedConfigFile]"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2b8,pcVar1,(allocator<char> *)(symbolName.field_2._M_local_buf + 0xf)
              );
    std::allocator<char>::~allocator((allocator<char> *)(symbolName.field_2._M_local_buf + 0xf));
    pcVar1 = (char *)((handler.m_tupleItems.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                     ).
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_string_length;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2e0,pcVar1,(allocator<char> *)(streamType.field_2._M_local_buf + 0xf)
              );
    std::allocator<char>::~allocator((allocator<char> *)(streamType.field_2._M_local_buf + 0xf));
    pcVar1 = (char *)((handler.m_tupleItems.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                     ).
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl.field_2._M_allocated_capacity;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stream,pcVar1,
               (allocator<char> *)
               ((long)&matcher.m_cachedStream.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&matcher.m_cachedStream.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stream,"F");
    matcher.m_cachedStream.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
    matcher.m_cachedStream.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar2;
    StockMatcher::StockMatcher
              ((StockMatcher *)&func._M_bound_args,(string *)local_2e0,(string *)local_2b8,
               (outputStreamType)
               matcher.m_cachedStream.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_890 = StockMatcher::executeMatching;
    local_888 = (_Elt_pointer)0x0;
    results.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&func._M_bound_args;
    std::bind<void(StockMatcher::*)(),StockMatcher*>
              ((type *)local_880,(offset_in_StockMatcher_to_subr *)&local_890,
               (StockMatcher **)
               &results.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_8b0);
    ThreadPool::enqueue<std::_Bind<void(StockMatcher::*(StockMatcher*))()>&>
              ((ThreadPool *)local_8c0,(_Bind<void_(StockMatcher::*(StockMatcher_*))()> *)&pool);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)local_8b0,
               (future<void> *)local_8c0);
    std::future<void>::~future((future<void> *)local_8c0);
    poVar3 = std::operator<<((ostream *)&std::cout,"Main Thread id = ");
    __id = std::this_thread::get_id();
    this = std::operator<<(poVar3,__id);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    __end1 = std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::begin
                       ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_8b0)
    ;
    iter = (future<void> *)
           std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::end
                     ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_8b0);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                                       *)&iter), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                ::operator*(&__end1);
      std::future<void>::get(this_00);
      __gnu_cxx::
      __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
      ::operator++(&__end1);
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_8b0);
    StockMatcher::~StockMatcher((StockMatcher *)&func._M_bound_args);
    std::__cxx11::string::~string((string *)&stream);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string((string *)local_2b8);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	if(argc == 2)
	{
		FeedFileHandler handler(argv[1],pool);
		handler.process();
		return(0);
	}

	if(argc != 4 && argc != 2)
	{
		std::cout << "Invalid Usage : Proper usage is OrderMatchingEngine [inputfile] [symbol] [F/C]" << std::endl;
		std::cout << "Invalid Usage : Proper usage is OrderMatchingEngine [feedConfigFile]" << std::endl;
		exit(1);
	}

	std::string inputFile = argv[1];
	std::string symbolName = argv[2];
	std::string streamType = argv[3];
	outputStreamType stream;

	if(streamType == "F")
		stream = outputStreamType::fileStream;
	else
		stream = outputStreamType::consoleStream;

	StockMatcher matcher(symbolName , inputFile, stream);
	auto func = std::bind(&StockMatcher::executeMatching, &matcher);
	std::vector<std::future<void>> results;
	results.emplace_back(pool.enqueue(func));
	std::cout << "Main Thread id = " << std::this_thread::get_id() << std::endl;
	for(auto&& iter : results)
		iter.get();
	return(0);
}